

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

bool jsonip::parser::
     or_<jsonip::parser::seq_<jsonip::parser::char_<(char)92>,jsonip::parser::anychar_,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>,jsonip::parser::notchar_<(char)34>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>>
     ::match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
               (ReaderState<jsonip::semantic_state,_jsonip::parser::Reader> *state)

{
  pointer *ppSVar1;
  iterator iVar2;
  Reader *pRVar3;
  PositionType pcVar4;
  char *pcVar5;
  size_t sVar6;
  PositionType pcVar7;
  bool bVar8;
  bool bVar9;
  PositionType p;
  PositionType p_2;
  pointer pSVar10;
  undefined1 auStack_20 [8];
  State cur_state;
  
  auStack_20 = (undefined1  [8])state->reader_->pos_;
  cur_state.pos_ = (PositionType)state->line_;
  iVar2._M_current =
       (state->stack_).
       super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (state->stack_).
      super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State>>
    ::
    _M_realloc_insert<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State_const&>
              ((vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State>>
                *)&state->stack_,iVar2,(State *)auStack_20);
  }
  else {
    (iVar2._M_current)->pos_ = (PositionType)auStack_20;
    (iVar2._M_current)->line_ = (size_t)cur_state.pos_;
    ppSVar1 = &(state->stack_).
               super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  auStack_20 = (undefined1  [8])state->reader_->pos_;
  cur_state.pos_ = (PositionType)state->line_;
  iVar2._M_current =
       (state->stack_).
       super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (state->stack_).
      super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State>>
    ::
    _M_realloc_insert<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State_const&>
              ((vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State>>
                *)&state->stack_,iVar2,(State *)auStack_20);
  }
  else {
    (iVar2._M_current)->pos_ = (PositionType)auStack_20;
    (iVar2._M_current)->line_ = (size_t)cur_state.pos_;
    ppSVar1 = &(state->stack_).
               super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  pRVar3 = state->reader_;
  pcVar4 = pRVar3->buf_;
  pcVar5 = pRVar3->pos_;
  sVar6 = pRVar3->len_;
  if ((((long)pcVar5 - (long)pcVar4 == sVar6) || (*pcVar5 != '\\')) ||
     (pRVar3->pos_ = pcVar5 + 1, (long)(pcVar5 + 1) - (long)pcVar4 == sVar6)) {
    bVar9 = false;
  }
  else {
    pRVar3->pos_ = pcVar5 + 2;
    bVar9 = true;
  }
  pcVar7 = pRVar3->pos_;
  if (bVar9) {
    if (state->max_pos_ < pcVar7) {
      state->max_pos_ = pcVar7;
    }
    pSVar10 = (state->stack_).
              super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    if (state->max_pos_ < pcVar7) {
      state->max_pos_ = pcVar7;
    }
    pRVar3->pos_ = (state->stack_).
                   super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].pos_;
    pSVar10 = (state->stack_).
              super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    state->line_ = pSVar10[-1].line_;
  }
  pSVar10 = pSVar10 + -1;
  (state->stack_).
  super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
  ._M_impl.super__Vector_impl_data._M_finish = pSVar10;
  bVar8 = true;
  if (!bVar9) {
    pcVar5 = pRVar3->pos_;
    if (((long)pcVar5 - (long)pcVar4 == sVar6) || (*pcVar5 == '\"')) {
      bVar8 = false;
    }
    else {
      pRVar3->pos_ = pcVar5 + 1;
    }
  }
  pcVar4 = pRVar3->pos_;
  if (bVar8) {
    if (state->max_pos_ < pcVar4) {
      state->max_pos_ = pcVar4;
    }
  }
  else {
    if (state->max_pos_ < pcVar4) {
      state->max_pos_ = pcVar4;
    }
    pRVar3->pos_ = (state->stack_).
                   super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].pos_;
    pSVar10 = (state->stack_).
              super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    state->line_ = pSVar10[-1].line_;
  }
  (state->stack_).
  super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
  ._M_impl.super__Vector_impl_data._M_finish = pSVar10 + -1;
  return bVar8;
}

Assistant:

static inline bool match(S& state)
        {
            state.push_state();

            bool var = C0::match(state) || C1::match(state) ||
                       C2::match(state) || C3::match(state) ||
                       C4::match(state) || C5::match(state) ||
                       C6::match(state) || C7::match(state);

            var ? state.commit() : state.rollback();

            return var;
        }